

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall
SPTest_ConstantExprInExpectation_Test::TestBody(SPTest_ConstantExprInExpectation_Test *this)

{
  Expr e;
  Expr expr;
  bool bVar1;
  SPAdapter *this_00;
  ExprBase file;
  ExprBase expected_expression;
  Type type;
  char *actual_expression;
  Objective OVar2;
  AssertionResult gtest_ar;
  NumericConstant constant;
  SPAdapter sp;
  TestBasicProblem p;
  undefined4 in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  SPAdapter *in_stack_fffffffffffff900;
  undefined7 in_stack_fffffffffffff908;
  undefined1 in_stack_fffffffffffff90f;
  ExprBase in_stack_fffffffffffff910;
  ExprBase in_stack_fffffffffffff918;
  int line;
  Message *in_stack_fffffffffffff978;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff980;
  TestProblem *in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff994;
  int in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  TestBasicProblem *in_stack_fffffffffffffa40;
  ColProblem *in_stack_fffffffffffffa58;
  SPAdapter *in_stack_fffffffffffffa60;
  
  TestBasicProblem::TestBasicProblem
            (in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38);
  mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (double)in_stack_fffffffffffff900);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (NumericConstant)in_stack_fffffffffffff910.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff900 >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (double)in_stack_fffffffffffff900);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (NumericConstant)in_stack_fffffffffffff910.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff900 >> 0x20));
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinary
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (Kind)((ulong)in_stack_fffffffffffff900 >> 0x20),
             (NumericExpr)in_stack_fffffffffffff918.impl_,
             (NumericExpr)in_stack_fffffffffffff910.impl_);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)25,_(mp::expr::Kind)38>
              )in_stack_fffffffffffff910.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff900 >> 0x20));
  expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffff994;
  expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffff990;
  TestProblem::AddExpectationObj(in_stack_fffffffffffff988,expr);
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
  OVar2 = mp::SPAdapter::obj(in_stack_fffffffffffff900,in_stack_fffffffffffff8fc);
  this_00 = OVar2.adapter_;
  type = OVar2.index_;
  file.impl_ = (Impl *)mp::SPAdapter::Objective::nonlinear_expr
                                 ((Objective *)
                                  CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffff910.impl_,
             (type_conflict1)((ulong)in_stack_fffffffffffff900 >> 0x20));
  e.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffff8fc;
  e.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffff8f8;
  expected_expression.impl_ = (Impl *)mp::Cast<mp::NumericConstant>(e);
  actual_expression = (char *)mp::NumericConstant::value((NumericConstant *)0x11c4f6);
  testing::internal::EqHelper<false>::Compare<int,double>
            ((char *)expected_expression.impl_,actual_expression,
             (int *)CONCAT17(in_stack_fffffffffffff90f,in_stack_fffffffffffff908),
             (double *)in_stack_fffffffffffff900);
  line = (int)((ulong)expected_expression.impl_ >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff978);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffff900 =
         (SPAdapter *)testing::AssertionResult::failure_message((AssertionResult *)0x11c5b7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,type,(char *)file.impl_,line,actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff980.ptr_,in_stack_fffffffffffff978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff900);
    testing::Message::~Message((Message *)0x11c605);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c654);
  mp::SPAdapter::~SPAdapter(in_stack_fffffffffffff900);
  TestBasicProblem::~TestBasicProblem((TestBasicProblem *)0x11c66e);
  return;
}

Assistant:

TEST(SPTest, ConstantExprInExpectation) {
  TestBasicProblem p(1);
  p.AddExpectationObj(
        p.MakeBinary(expr::MUL, p.MakeNumericConstant(6),
                     p.MakeNumericConstant(7)));
  mp::SPAdapter sp(p);
  auto constant = mp::Cast<mp::NumericConstant>(sp.obj(0).nonlinear_expr());
  EXPECT_EQ(42, constant.value());
}